

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printValue(PrinterStream *this,Value *v)

{
  bool bVar1;
  Type *pTVar2;
  CodePrinter *pCVar3;
  string local_50;
  undefined1 local_30 [8];
  Printer p;
  Value *v_local;
  PrinterStream *this_local;
  
  p.outStream = (CodePrinter *)v;
  printValue(soul::Value_const&)::Printer::Printer(choc::text::CodePrinter__(local_30,this->out);
  pTVar2 = soul::Value::getType((Value *)p.outStream);
  bVar1 = Type::isPrimitiveInteger(pTVar2);
  if (!bVar1) {
    pTVar2 = soul::Value::getType((Value *)p.outStream);
    bVar1 = Type::isPrimitiveFloat(pTVar2);
    if (!bVar1) {
      pCVar3 = this->out;
      pTVar2 = soul::Value::getType((Value *)p.outStream);
      getTypeDescription_abi_cxx11_(&local_50,this,pTVar2);
      pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,&local_50);
      choc::text::CodePrinter::operator<<(pCVar3,' ');
      std::__cxx11::string::~string((string *)&local_50);
      p.super_ValuePrinter._vptr_ValuePrinter =
           (_func_int **)Program::getStringDictionary(&this->module->program);
    }
  }
  soul::Value::print((Value *)p.outStream,(ValuePrinter *)local_30);
  printValue::Printer::~Printer((Printer *)local_30);
  return;
}

Assistant:

void printValue (const Value& v)
        {
            struct Printer  : public ValuePrinter
            {
                Printer (choc::text::CodePrinter& s) : outStream (s) {}

                void print (std::string_view s) override    { outStream << s; }
                void printFloat32 (float value) override    { if (value == 0) print ("0.0f"); else ValuePrinter::printFloat32 (value); }
                void printFloat64 (double value) override   { if (value == 0) print ("0.0");  else ValuePrinter::printFloat64 (value); }

                void printStringLiteral (StringDictionary::Handle h) override
                {
                    print (dictionary != nullptr ? toHeartStringLiteral (dictionary->getStringForHandle (h))
                                                 : std::to_string (h.handle));
                }

                choc::text::CodePrinter& outStream;
            };

            Printer p { out };

            if (! (v.getType().isPrimitiveInteger() || v.getType().isPrimitiveFloat()))
            {
                out << getTypeDescription (v.getType()) << ' ';
                p.dictionary = std::addressof (module.program.getStringDictionary());
            }

            v.print (p);
        }